

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

DisasJumpType op_cs(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 cmpv;
  TCGv_i64 retv;
  TCGv_i64 newv;
  uint uVar1;
  TCGv_i64 addr;
  TCGTemp *ts;
  uintptr_t o_1;
  
  uVar1 = (s->fields).presentO;
  if (((uVar1 >> 0xc & 1) != 0) && ((uVar1 >> 9 & 1) != 0)) {
    tcg_ctx = s->uc->tcg_ctx;
    addr = get_address(s,0,(s->fields).c[1],(s->fields).c[5]);
    cmpv = o->in2;
    retv = o->out;
    newv = o->in1;
    uVar1 = get_mem_index((DisasContext_conflict13 *)(ulong)((s->base).tb)->flags);
    tcg_gen_atomic_cmpxchg_i64_s390x
              (tcg_ctx,retv,addr,cmpv,newv,(ulong)uVar1,(MemOp_conflict)s->insn->data | MO_ALIGN);
    tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
    ts = tcg_temp_new_internal_s390x(tcg_ctx,TCG_TYPE_I64,false);
    tcg_gen_setcond_i64_s390x
              (tcg_ctx,TCG_COND_NE,(TCGv_i64)((long)ts - (long)tcg_ctx),o->in2,o->out);
    tcg_gen_extrl_i64_i32_s390x(tcg_ctx,tcg_ctx->cc_op,(TCGv_i64)((long)ts - (long)tcg_ctx));
    tcg_temp_free_internal_s390x(tcg_ctx,ts);
    set_cc_static(s);
    return DISAS_NEXT;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_cs(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int d2 = get_field(s, d2);
    int b2 = get_field(s, b2);
    TCGv_i64 addr, cc;

    /* Note that in1 = R3 (new value) and
       in2 = (zero-extended) R1 (expected value).  */

    addr = get_address(s, 0, b2, d2);
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, o->out, addr, o->in2, o->in1,
                               get_mem_index(s), s->insn->data | MO_ALIGN);
    tcg_temp_free_i64(tcg_ctx, addr);

    /* Are the memory and expected values (un)equal?  Note that this setcond
       produces the output CC value, thus the NE sense of the test.  */
    cc = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, cc, o->in2, o->out);
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cc_op, cc);
    tcg_temp_free_i64(tcg_ctx, cc);
    set_cc_static(s);

    return DISAS_NEXT;
}